

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall Renderer::Renderer(Renderer *this)

{
  this->deltaTime = 0.0;
  this->lastFrame = 0.0;
  glfwInit();
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x22008,0x32001);
  return;
}

Assistant:

Renderer::Renderer() {
	// instantiate the GLFW windo
	glfwInit();
	glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
	glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
	//glfwWindowHint(GLFW_RESIZABLE, GL_FALSE);
}